

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O3

void __thiscall TPZGeoMesh::~TPZGeoMesh(TPZGeoMesh *this)

{
  ~TPZGeoMesh(this,&VTT);
  operator_delete(this,0x2a8);
  return;
}

Assistant:

TPZGeoMesh::~TPZGeoMesh()
{
#ifdef PZDEBUG2
    std::cout << "Deleting TPZGeoMesh " << (void *) this << std::endl;
#endif
	CleanUp();
}